

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_01;
  pointer pcVar2;
  pointer pbVar3;
  pointer ppcVar4;
  bool bVar5;
  string *config;
  char *pcVar6;
  string *psVar7;
  cmCustomCommand *pcVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar10;
  pointer ppcVar11;
  pointer pbVar12;
  string *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  string *in_path;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  string currentBinDir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  anon_class_16_2_381a533d evaluatedFiles;
  undefined1 local_1c8 [40];
  undefined1 local_1a0 [32];
  cmCustomCommand *local_180;
  undefined1 local_178 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [5];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_c8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_a8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_88;
  string local_68;
  cmCustomCommand *local_48;
  cmMakefileTargetGenerator *local_40;
  string *local_38;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CMAKE_BUILD_TYPE","");
  config = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_178);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
      local_168) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_168[0]._M_dataplus._M_p + 1));
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_178._0_8_ = local_168;
  local_40 = this;
  local_38 = config;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"ADDITIONAL_MAKE_CLEAN_FILES","");
  pcVar6 = cmMakefile::GetProperty(pcVar1,(string *)local_178);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
      local_168) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_168[0]._M_dataplus._M_p + 1));
  }
  if (pcVar6 != (char *)0x0) {
    WriteTargetBuildRules()::$_0::operator()[abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178,&local_40,pcVar6);
    this_00 = &this->CleanFiles;
    local_1a0._0_8_ = this_00;
    if (local_178._0_8_ != local_178._8_8_) {
      __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,(const_iterator)&(this->CleanFiles)._M_t._M_impl.super__Rb_tree_header
                   ,__v,(_Alloc_node *)local_1a0);
        __v = __v + 1;
      } while (__v != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_178._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
  }
  this_01 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"ADDITIONAL_CLEAN_FILES","");
  pcVar6 = cmGeneratorTarget::GetProperty(this_01,(string *)local_178);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
      local_168) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_168[0]._M_dataplus._M_p + 1));
  }
  if (pcVar6 != (char *)0x0) {
    WriteTargetBuildRules()::$_0::operator()[abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,&local_40,pcVar6);
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)this->LocalGenerator);
    if (local_1a0._0_8_ != local_1a0._8_8_) {
      in_path = (string *)local_1a0._0_8_;
      do {
        cmsys::SystemTools::CollapseFullPath((string *)local_178,in_path,psVar7);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->CleanFiles,(string *)local_178);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
            local_168) {
          operator_delete((void *)local_178._0_8_,(ulong)(local_168[0]._M_dataplus._M_p + 1));
        }
        in_path = in_path + 1;
      } while (in_path != (string *)local_1a0._8_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a0);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"CLEAN_NO_CUSTOM","");
  pcVar6 = cmMakefile::GetProperty(pcVar1,(string *)local_178);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
      local_168) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_168[0]._M_dataplus._M_p + 1));
  }
  bVar5 = cmSystemTools::IsOff(pcVar6);
  local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_88,config);
  psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)this->LocalGenerator);
  local_1a0._0_8_ = local_1a0 + 0x10;
  pcVar2 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,pcVar2,pcVar2 + psVar7->_M_string_length);
  local_48 = (cmCustomCommand *)
             local_88.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar8 = (cmCustomCommand *)
             local_88.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_start;
    do {
      local_180 = pcVar8;
      pcVar8 = cmSourceFile::GetCustomCommand
                         ((cmSourceFile *)
                          (pcVar8->Outputs).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar2 = (this->super_cmCommonTargetGenerator).ConfigName._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,
                 pcVar2 + (this->super_cmCommonTargetGenerator).ConfigName._M_string_length);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_178,pcVar8,&local_68,
                 (cmLocalGenerator *)this->LocalGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)local_178);
      if (bVar5) {
        pvVar9 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                           ((cmCustomCommandGenerator *)local_178);
        pbVar3 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (pvVar9->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
            pbVar12 = pbVar12 + 1) {
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)local_1c8,(cmLocalGenerator *)this->LocalGenerator,
                     (string *)local_1a0,pbVar12);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->CleanFiles,(string *)local_1c8);
          if ((cmCustomCommand *)local_1c8._0_8_ != (cmCustomCommand *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
        }
        pvVar9 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                           ((cmCustomCommandGenerator *)local_178);
        pbVar3 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (pvVar9->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
            pbVar12 = pbVar12 + 1) {
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)local_1c8,(cmLocalGenerator *)this->LocalGenerator,
                     (string *)local_1a0,pbVar12);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->CleanFiles,(string *)local_1c8);
          if ((cmCustomCommand *)local_1c8._0_8_ != (cmCustomCommand *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
        }
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_178);
      pcVar8 = (cmCustomCommand *)
               &(local_180->Outputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (pcVar8 != local_48);
  }
  if (bVar5) {
    pvVar10 = cmGeneratorTarget::GetPreBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_1c8,pvVar10);
    pvVar10 = cmGeneratorTarget::GetPreLinkCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_1c8,local_1c8._8_8_,
               (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    pvVar10 = cmGeneratorTarget::GetPostBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_1c8,local_1c8._8_8_,
               (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar10->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    local_180 = (cmCustomCommand *)local_1c8._8_8_;
    if (local_1c8._0_8_ != local_1c8._8_8_) {
      pcVar8 = (cmCustomCommand *)local_1c8._0_8_;
      do {
        pvVar9 = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar8);
        pbVar3 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (pvVar9->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
            pbVar12 = pbVar12 + 1) {
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)local_178,(cmLocalGenerator *)this->LocalGenerator,
                     (string *)local_1a0,pbVar12);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->CleanFiles,(string *)local_178);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
              != local_168) {
            operator_delete((void *)local_178._0_8_,(ulong)(local_168[0]._M_dataplus._M_p + 1));
          }
        }
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 != local_180);
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_1c8);
  }
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_168[0]._M_dataplus._M_p = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_178,config
            );
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            ((this->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_178,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1c8._16_8_ = 0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_1c8,config
            );
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            ((this->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_1c8,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_a8,config);
  ppcVar4 = local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppcVar11 = local_a8.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      psVar7 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar11);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ExternalObjects,psVar7);
      ppcVar11 = ppcVar11 + 1;
    } while (ppcVar11 != ppcVar4);
  }
  local_c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_c8,config);
  ppcVar4 = local_c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar11 = local_c8.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar11 != ppcVar4;
      ppcVar11 = ppcVar11 + 1) {
    WriteObjectRuleFiles(this,*ppcVar11);
  }
  if (local_c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ - local_1c8._0_8_);
  }
  if ((pointer)local_178._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_178._0_8_,(long)local_168[0]._M_dataplus._M_p - local_178._0_8_);
  }
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_1a0._0_8_ !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)(local_1a0 + 0x10)) {
    operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
  }
  if ((cmCustomCommand *)
      local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (cmCustomCommand *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  // -- Write the custom commands for this target

  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // Evaluates generator expressions and expands prop_value
  auto evaluatedFiles =
    [this, &config](const char* prop_value) -> std::vector<std::string> {
    std::vector<std::string> files;
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop_value);
    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this->LocalGenerator, config, false, this->GeneratorTarget,
                    nullptr, nullptr),
      files);
    return files;
  };

  // Look for additional files registered for cleaning in this directory.
  if (const char* prop_value =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(prop_value);
    this->CleanFiles.insert(files.begin(), files.end());
  }

  // Look for additional files registered for cleaning in this target.
  if (const char* prop_value =
        this->GeneratorTarget->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    std::vector<std::string> const files = evaluatedFiles(prop_value);
    // For relative path support
    std::string const& binaryDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& cfl : files) {
      this->CleanFiles.insert(cmSystemTools::CollapseFullPath(cfl, binaryDir));
    }
  }

  // add custom commands to the clean rules?
  const char* clean_no_custom = this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (cmSourceFile const* sf : customCommands) {
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(), this->ConfigName,
                                 this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    cmAppend(buildEventCommands, this->GeneratorTarget->GetPreLinkCommands());
    cmAppend(buildEventCommands,
             this->GeneratorTarget->GetPostBuildCommands());

    for (const auto& be : buildEventCommands) {
      const std::vector<std::string>& byproducts = be.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for (cmSourceFile const* sf : externalObjects) {
    this->ExternalObjects.push_back(sf->GetFullPath());
  }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for (cmSourceFile const* sf : objectSources) {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(*sf);
  }
}